

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O2

bool __thiscall CppJieba::Trie::dispose(Trie *this)

{
  bool bVar1;
  allocator local_29;
  string local_28;
  
  if (this->_initFlag == true) {
    bVar1 = _deleteNode(this,this->_root);
    if (bVar1) {
      this->_root = (TrieNode *)0x0;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::clear
                (&this->_nodeInfoVec);
      this->_initFlag = false;
      return true;
    }
    std::__cxx11::string::string((string *)&local_28,"_deleteNode failed!",&local_29);
    Limonp::Logger::LoggingF(4,"Trie.hpp",0x75,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return false;
}

Assistant:

bool dispose()
            {
                if(!_getInitFlag())
                {
                    return false;
                }
                bool ret = _deleteNode(_root);
                if(!ret)
                {
                    LogFatal("_deleteNode failed!");
                    return false;
                }
                _root = NULL;
                _nodeInfoVec.clear();

                _setInitFlag(false);
                return ret;
            }